

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::syntax::UdpFieldBaseSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::UdpFieldBaseSyntax_*> *this,size_type newCapacity)

{
  pointer __dest;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  __dest = (pointer)operator_new(newCapacity * 8);
  if (this->len != 0) {
    ctx = (EVP_PKEY_CTX *)this->data_;
    memmove(__dest,ctx,this->len << 3);
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = __dest;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }